

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFindPackageCommand::InitialPass
          (cmFindPackageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  cmState *this_01;
  pointer pbVar11;
  long lVar12;
  undefined7 extraout_var;
  ostream *poVar13;
  _Base_ptr p_Var14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  ulong uVar16;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_02;
  undefined1 __v_00 [8];
  string exact;
  string disableFindPackageVar;
  uint parsed_tweak;
  string components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignored;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doubledComponents;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> moduleArgs;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> configArgs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionalComponents;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredComponents;
  RegularExpression version;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  uint local_41c;
  string local_418;
  undefined1 local_3f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [6];
  ios_base local_388 [264];
  char *local_280;
  ulong local_278;
  char *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  string local_220;
  string local_200;
  string local_1e0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_3f8 = (undefined1  [8])local_3e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f8,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,(string *)local_3f8);
    if (local_3f8 != (undefined1  [8])local_3e8) {
      operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_3f8 = (undefined1  [8])local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"CMAKE_MINIMUM_REQUIRED_VERSION","");
  pcVar10 = cmMakefile::GetDefinition(pcVar1,(string *)local_3f8);
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  if (pcVar10 != (char *)0x0) {
    paStack_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((ulong)paStack_3f0 & 0xffffffff00000000);
    local_3f8 = (undefined1  [8])0x0;
    __isoc99_sscanf(pcVar10,"%u.%u.%u",local_3f8,local_3f8 + 4);
    this->RequiredCMakeVersion =
         (ulong)((uint)paStack_3f0 % 100000000) +
         ((ulong)((uint)local_3f8._4_4_ % 1000) + (ulong)(uint)(local_3f8._0_4_ * 1000)) * 100000000
    ;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_3f8 = (undefined1  [8])local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"CMAKE_FIND_DEBUG_MODE","");
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_3f8);
  this->DebugMode = bVar5;
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_3f8 = (undefined1  [8])local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"CMAKE_LIBRARY_ARCHITECTURE","");
  pcVar10 = cmMakefile::GetDefinition(pcVar1,(string *)local_3f8);
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  if (pcVar10 != (char *)0x0) {
    pcVar15 = (char *)(this->LibraryArchitecture)._M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)&this->LibraryArchitecture,0,pcVar15,(ulong)pcVar10);
  }
  bVar5 = cmMakefile::PlatformIs64Bit((this->super_cmFindCommon).super_cmCommand.Makefile);
  if (bVar5) {
    this_01 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    local_3f8 = (undefined1  [8])local_3e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f8,"FIND_LIBRARY_USE_LIB64_PATHS","");
    bVar5 = cmState::GetGlobalPropertyAsBool(this_01,(string *)local_3f8);
    if (local_3f8 != (undefined1  [8])local_3e8) {
      operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
    }
    if (bVar5) {
      this->UseLib64Paths = true;
    }
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_3f8 = (undefined1  [8])local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY","");
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_3f8);
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  if (bVar5) {
    this->NoUserRegistry = true;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_3f8 = (undefined1  [8])local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY","");
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_3f8);
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  if (bVar5) {
    this->NoSystemRegistry = true;
  }
  cmFindCommon::SelectDefaultRootPathMode(&this->super_cmFindCommon);
  cmFindCommon::SelectDefaultMacMode(&this->super_cmFindCommon);
  local_428 = &this->Name;
  std::__cxx11::string::_M_assign((string *)local_428);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3f8 = (undefined1  [8])local_3e8;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_cmFindCommon).SearchPathSuffixes,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8);
  if (local_3f8 != (undefined1  [8])local_3e8) {
    operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
  }
  local_270 = "";
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"^[0-9.]+$");
  local_190._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_impl.super__Rb_tree_header._M_header;
  iVar8 = 0;
  local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1c0._M_impl.super__Rb_tree_header._M_header;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_dataplus._M_p._0_4_ = 1;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
    local_240 = &this->Configs;
    local_228 = &(this->super_cmFindCommon).UserHintsArgs;
    local_230 = &(this->super_cmFindCommon).UserGuessArgs;
    local_238 = &this->Names;
    local_248 = (string *)&this->Version;
    uVar16 = 1;
    local_278 = 0;
LAB_003c4f01:
    iVar7 = std::__cxx11::string::compare((char *)(pbVar11 + uVar16));
    if (iVar7 == 0) {
      this->Quiet = true;
LAB_003c5175:
      iVar8 = 0;
    }
    else {
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                 ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
      if (iVar7 == 0) {
        this->VersionExact = true;
        goto LAB_003c5175;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                 ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
      this_02 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 *)&local_1c0;
      if (((iVar7 == 0) ||
          (iVar7 = std::__cxx11::string::compare
                             ((char *)((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                                      ((ulong)local_468._M_dataplus._M_p & 0xffffffff))),
          this_02 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     *)&local_190, iVar7 == 0)) ||
         (iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                     ((ulong)local_468._M_dataplus._M_p & 0xffffffff))), iVar7 == 0)
         ) goto LAB_003c5218;
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                 ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
      if (iVar7 == 0) {
        this->Required = true;
LAB_003c5184:
        iVar8 = 1;
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                   ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
        if (iVar7 == 0) goto LAB_003c5184;
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                   ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
        if (iVar7 == 0) {
          iVar8 = 2;
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                     ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
          if (iVar7 == 0) {
            iVar8 = 3;
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_190,(uint *)&local_468);
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                       ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
            if (iVar7 == 0) {
              iVar8 = 4;
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)&local_190,(uint *)&local_468);
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start +
                                         ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
              if (iVar7 == 0) {
                iVar8 = 7;
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_190,(uint *)&local_468);
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start +
                                           ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
                if (iVar7 == 0) {
                  iVar8 = 5;
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_190,(uint *)&local_468);
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start +
                                             ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
                  if (iVar7 == 0) {
                    iVar8 = 6;
                    std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_190,(uint *)&local_468);
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                               ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
                    if (iVar7 == 0) {
                      this->PolicyScope = false;
                      goto LAB_003c5175;
                    }
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                               ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
                    if (iVar7 == 0) {
                      this->NoUserRegistry = true;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 ((ulong)local_468._M_dataplus._M_p & 0xffffffff)));
                      if (iVar7 == 0) {
                        this->NoSystemRegistry = true;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  ((ulong)local_468._M_dataplus._M_p & 0xffffffff)))
                        ;
                        if ((iVar7 != 0) &&
                           (bVar5 = cmFindCommon::CheckCommonArgument
                                              (&this->super_cmFindCommon,
                                               (args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start +
                                               ((ulong)local_468._M_dataplus._M_p & 0xffffffff)),
                           !bVar5)) {
                          if (iVar8 - 1U < 2) {
                            __v = (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                  ((ulong)local_468._M_dataplus._M_p & 0xffffffff);
                            if (iVar8 == 2) {
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)&local_160,__v);
                              local_280 = "0";
                            }
                            else {
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)&local_130,__v);
                              local_280 = "1";
                            }
                            std::operator+(&local_448,local_428,"_FIND_REQUIRED_");
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_3f8,&local_448,
                                           (args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                           ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_448._M_dataplus._M_p != &local_448.field_2) {
                              operator_delete(local_448._M_dataplus._M_p,
                                              local_448.field_2._M_allocated_capacity + 1);
                            }
                            AddFindDefinition(this,(string *)local_3f8,local_280);
                            std::__cxx11::string::append((char *)&local_418);
                            std::__cxx11::string::_M_append
                                      ((char *)&local_418,
                                       (ulong)(args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start
                                              [(ulong)local_468._M_dataplus._M_p & 0xffffffff].
                                              _M_dataplus._M_p);
                            if (local_3f8 != (undefined1  [8])local_3e8) {
                              operator_delete((void *)local_3f8,
                                              local_3e8[0]._M_allocated_capacity + 1);
                            }
                            local_270 = ";";
                          }
                          else {
                            switch(iVar8) {
                            case 3:
                              iVar8 = 3;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(local_238,
                                          (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                              break;
                            case 4:
                              iVar8 = 4;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(local_230,
                                          (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                              break;
                            case 5:
                              iVar8 = 5;
                              cmFindCommon::AddPathSuffix
                                        (&this->super_cmFindCommon,
                                         (args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                         ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                              break;
                            case 6:
                              lVar12 = std::__cxx11::string::find_first_of
                                                 ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  ((ulong)local_468._M_dataplus._M_p & 0xffffffff)),
                                                  0x5a4f7c,0);
                              if (lVar12 == -1) {
                                cmsys::SystemTools::GetFilenameLastExtension
                                          ((string *)local_3f8,
                                           (args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                           ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                                iVar8 = std::__cxx11::string::compare((char *)local_3f8);
                                if (local_3f8 != (undefined1  [8])local_3e8) {
                                  operator_delete((void *)local_3f8,
                                                  local_3e8[0]._M_allocated_capacity + 1);
                                }
                                if (iVar8 == 0) {
                                  iVar8 = 6;
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::push_back(local_240,
                                              (args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start +
                                              ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                                  break;
                                }
                              }
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,
                                         "given CONFIGS option followed by invalid file name \"",
                                         0x34);
                              pbVar11 = (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start;
                              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_3f8,
                                                   pbVar11[(ulong)local_468._M_dataplus._M_p &
                                                           0xffffffff]._M_dataplus._M_p,
                                                   pbVar11[(ulong)local_468._M_dataplus._M_p &
                                                           0xffffffff]._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,"\".  The names given must be file names without ",
                                         0x2f);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,"a path and with a \".cmake\" extension.",0x25);
                              std::__cxx11::stringbuf::str();
                              cmCommand::SetError((cmCommand *)this,&local_448);
LAB_003c6380:
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                                operator_delete(local_448._M_dataplus._M_p,
                                                local_448.field_2._M_allocated_capacity + 1);
                              }
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_3f8);
                              std::ios_base::~ios_base(local_388);
                              bVar5 = false;
                              goto LAB_003c56c2;
                            case 7:
                              iVar8 = 7;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(local_228,
                                          (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
                              break;
                            default:
                              if (((local_278 & 1) != 0) ||
                                 (bVar5 = cmsys::RegularExpression::find
                                                    (&local_100,
                                                     (args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [(ulong)local_468._M_dataplus._M_p & 0xffffffff].
                                                  _M_dataplus._M_p), !bVar5)) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_3f8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_3f8,"called with invalid argument \"",
                                           0x1e);
                                pbVar11 = (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start;
                                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_3f8,
                                                     pbVar11[(ulong)local_468._M_dataplus._M_p &
                                                             0xffffffff]._M_dataplus._M_p,
                                                     pbVar11[(ulong)local_468._M_dataplus._M_p &
                                                             0xffffffff]._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                                std::__cxx11::stringbuf::str();
                                cmCommand::SetError((cmCommand *)this,&local_448);
                                goto LAB_003c6380;
                              }
                              local_278 = CONCAT71(extraout_var,1);
                              std::__cxx11::string::_M_assign(local_248);
                            }
                          }
                          goto LAB_003c5223;
                        }
                      }
                    }
LAB_003c5218:
                    iVar8 = 0;
                    std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>(this_02,(uint *)&local_468);
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_003c5223:
    uVar16 = (ulong)((uint)local_468._M_dataplus._M_p + 1);
    local_468._M_dataplus._M_p._0_4_ = (uint)local_468._M_dataplus._M_p + 1;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <= uVar16)
    goto LAB_003c54ba;
    goto LAB_003c4f01;
  }
LAB_003c54ba:
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_130._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_130._M_impl.super__Rb_tree_header,
             local_160._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_160._M_impl.super__Rb_tree_header);
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->UseFindModules = local_190._M_impl.super__Rb_tree_header._M_node_count == 0;
    this->UseConfigFiles = local_1c0._M_impl.super__Rb_tree_header._M_node_count == 0;
    if (local_1c0._M_impl.super__Rb_tree_header._M_node_count == 0 ||
        local_190._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if ((this->Version)._M_string_length == 0) {
        if (this->VersionExact == true) {
          this->VersionExact = false;
          pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          local_3f8 = (undefined1  [8])local_3e8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"Ignoring EXACT since no version is requested.","");
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)local_3f8);
          if (local_3f8 != (undefined1  [8])local_3e8) {
            operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
          }
          if (((this->Version)._M_string_length != 0) &&
             ((char *)local_418._M_string_length != (char *)0x0)) goto LAB_003c5bb8;
        }
LAB_003c59c5:
        local_3f8 = (undefined1  [8])local_3e8;
        pcVar2 = (this->Name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f8,pcVar2,pcVar2 + (this->Name)._M_string_length);
        std::__cxx11::string::append(local_3f8);
        bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)local_3f8);
        if (bVar5) {
          if ((this->Version)._M_string_length == 0) {
            pcVar2 = (this->Name)._M_dataplus._M_p;
            local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_448,pcVar2,pcVar2 + (this->Name)._M_string_length);
            std::__cxx11::string::append((char *)&local_448);
            pcVar15 = cmMakefile::GetSafeDefinition
                                ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_448);
            pcVar10 = (char *)(this->Version)._M_string_length;
            strlen(pcVar15);
            std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar10,(ulong)pcVar15);
            pcVar2 = (this->Name)._M_dataplus._M_p;
            local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_468,pcVar2,pcVar2 + (this->Name)._M_string_length);
            std::__cxx11::string::append((char *)&local_468);
            bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468)
            ;
            this->VersionExact = bVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_448._M_dataplus._M_p != &local_448.field_2) {
              operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((char *)local_418._M_string_length == (char *)0x0) {
            pcVar2 = (this->Name)._M_dataplus._M_p;
            local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_448,pcVar2,pcVar2 + (this->Name)._M_string_length);
            std::__cxx11::string::append((char *)&local_448);
            pcVar10 = cmMakefile::GetSafeDefinition
                                ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_448);
            sVar3 = local_418._M_string_length;
            strlen(pcVar10);
            std::__cxx11::string::_M_replace((ulong)&local_418,0,(char *)sVar3,(ulong)pcVar10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_448._M_dataplus._M_p != &local_448.field_2) {
              operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if (local_3f8 != (undefined1  [8])local_3e8) {
          operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
        }
        if ((this->Version)._M_string_length != 0) goto LAB_003c5bb8;
      }
      else {
        if ((char *)local_418._M_string_length == (char *)0x0) goto LAB_003c59c5;
LAB_003c5bb8:
        uVar9 = __isoc99_sscanf((this->Version)._M_dataplus._M_p,"%u.%u.%u.%u",local_3f8,&local_448,
                                &local_468,&local_41c);
        this->VersionCount = uVar9;
        switch(uVar9) {
        case 4:
          this->VersionTweak = local_41c;
        case 3:
          this->VersionPatch = (uint)local_468._M_dataplus._M_p;
        case 2:
          this->VersionMinor = (uint)local_448._M_dataplus._M_p;
        case 1:
          this->VersionMajor = local_3f8._0_4_;
        }
      }
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_448,"CMAKE_DISABLE_FIND_PACKAGE_","");
      std::__cxx11::string::_M_append((char *)&local_448,(ulong)(this->Name)._M_dataplus._M_p);
      bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_448);
      if (bVar5) {
        bVar5 = true;
        if (this->Required == true) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"for module ",0xb)
          ;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," called with REQUIRED, but ",0x1b);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_448._M_dataplus._M_p,local_448._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," is enabled. A REQUIRED package cannot be disabled.",0x33);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError((cmCommand *)this,&local_468);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
          std::ios_base::~ios_base(local_388);
          bVar5 = false;
        }
      }
      else {
        SetModuleVariables(this,&local_418);
        bVar6 = this->UseFindModules;
        if ((bool)bVar6 == true) {
          local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffffffffff00);
          bVar5 = FindModule(this,(bool *)local_3f8);
          if ((!bVar5) || (local_3f8[0] == (string)0x1)) {
            AppendSuccessInformation(this);
            goto LAB_003c6265;
          }
          bVar6 = this->UseFindModules;
        }
        if (((bVar6 & 1) != 0) && (this->UseConfigFiles == true)) {
          pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          local_3f8 = (undefined1  [8])local_3e8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"CMAKE_FIND_PACKAGE_WARN_NO_MODULE","");
          bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_3f8);
          if (local_3f8 != (undefined1  [8])local_3e8) {
            operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
          }
          if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
            if (this->RequiredCMakeVersion < 0x2ec09cd808) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f8,
                         "find_package called without NO_MODULE option and no Find",0x38);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,
                         ".cmake module is in CMAKE_MODULE_PATH.  Add NO_MODULE to exclusively request Config mode and search for a package configuration file provided by "
                         ,0x91);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," (",2);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Config.cmake or ",0x10);
              cmsys::SystemTools::LowerCase(&local_468,local_428);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_468._M_dataplus._M_p,local_468._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"-config.cmake).  Otherwise make Find",0x24);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,".cmake available in CMAKE_MODULE_PATH.",0x26);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f8,
                         "find_package called without either MODULE or CONFIG option and no Find",
                         0x46);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,
                         ".cmake module is in CMAKE_MODULE_PATH.  Add MODULE to exclusively request Module mode and fail if Find"
                         ,0x66);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,
                         ".cmake is missing.  Add CONFIG to exclusively request Config mode and search for a package configuration file provided by "
                         ,0x7a);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," (",2);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Config.cmake or ",0x10);
              cmsys::SystemTools::LowerCase(&local_468,local_428);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_468._M_dataplus._M_p,local_468._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"-config.cmake).  ",0x11);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f8,
                       "\n(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)",0x43);
            pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_468);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
            std::ios_base::~ios_base(local_388);
          }
        }
        std::__cxx11::string::_M_assign((string *)&this->Variable);
        std::__cxx11::string::append((char *)&this->Variable);
        if ((this->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Names,local_428);
        }
        if (((this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pbVar11 = (this->Names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           pbVar11 !=
           (this->Names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          do {
            local_3f8 = (undefined1  [8])local_3e8;
            pcVar2 = (pbVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3f8,pcVar2,pcVar2 + pbVar11->_M_string_length);
            std::__cxx11::string::append((char *)local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Configs,(value_type *)local_3f8);
            cmsys::SystemTools::LowerCase(&local_468,pbVar11);
            std::__cxx11::string::operator=((string *)local_3f8,(string *)&local_468);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Configs,(value_type *)local_3f8);
            if (local_3f8 != (undefined1  [8])local_3e8) {
              operator_delete((void *)local_3f8,local_3e8[0]._M_allocated_capacity + 1);
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 !=
                   (this->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_3f8 = (undefined1  [8])0x0;
        paStack_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_3e8[0]._M_allocated_capacity = 0;
        cmFindCommon::GetIgnoredPaths
                  (&this->super_cmFindCommon,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3f8);
        cmFindCommon::RerootPaths
                  (&this->super_cmFindCommon,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3f8);
        this_00 = &this->IgnoredPaths;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this_00->_M_t);
        paVar4 = paStack_3f0;
        local_468._M_dataplus._M_p = (pointer)this_00;
        if (local_3f8 != (undefined1  [8])paStack_3f0) {
          __v_00 = local_3f8;
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,
                       (const_iterator)&(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v_00,
                       (_Alloc_node *)&local_468);
            __v_00 = (undefined1  [8])((long)__v_00 + 0x20);
          } while (__v_00 != (undefined1  [8])paVar4);
        }
        bVar5 = HandlePackageMode(this);
        AppendSuccessInformation(this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3f8);
      }
LAB_003c6265:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003c56b5;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"given options exclusive to Module mode:\n",0x28);
    if ((_Rb_tree_header *)local_1c0._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_1c0._M_impl.super__Rb_tree_header) {
      p_Var14 = local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"  ",2);
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pbVar11[p_Var14[1]._M_color]._M_dataplus._M_p,
                             pbVar11[p_Var14[1]._M_color]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != &local_1c0._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"and options exclusive to Config mode:\n",0x26);
    if ((_Rb_tree_header *)local_190._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_190._M_impl.super__Rb_tree_header) {
      p_Var14 = local_190._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"  ",2);
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pbVar11[p_Var14[1]._M_color]._M_dataplus._M_p,
                             pbVar11[p_Var14[1]._M_color]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != &local_190._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"The options are incompatible.",0x1d);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) goto LAB_003c5688;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f8,"called with components that are both required and optional:\n",
               0x3c);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"  ","");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\n","");
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_448,&local_1e0,&local_268,&local_200,&local_220);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f8,local_448._M_dataplus._M_p,local_448._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
LAB_003c5688:
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base(local_388);
  bVar5 = false;
LAB_003c56b5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
LAB_003c56c2:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1c0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_190);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,
                    CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                             local_418.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmFindPackageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Lookup required version of CMake.
  if(const char* rv =
     this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION"))
    {
    unsigned int v[3] = {0,0,0};
    sscanf(rv, "%u.%u.%u", &v[0], &v[1], &v[2]);
    this->RequiredCMakeVersion = CMake_VERSION_ENCODE(v[0],v[1],v[2]);
    }

  // Check for debug mode.
  this->DebugMode = this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE");

  // Lookup target architecture, if any.
  if(const char* arch =
     this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE"))
    {
    this->LibraryArchitecture = arch;
    }

  // Lookup whether lib64 paths should be used.
  if(this->Makefile->PlatformIs64Bit() &&
     this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    this->UseLib64Paths = true;
    }

  // Check if User Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY"))
    {
    this->NoUserRegistry = true;
    }

  // Check if System Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY"))
    {
    this->NoSystemRegistry = true;
    }

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  // Record options.
  this->Name = args[0];
  std::string components;
  const char* components_sep = "";
  std::set<std::string> requiredComponents;
  std::set<std::string> optionalComponents;

  // Always search directly in a generated path.
  this->SearchPathSuffixes.push_back("");

  // Parse the arguments.
  enum Doing { DoingNone, DoingComponents, DoingOptionalComponents, DoingNames,
               DoingPaths, DoingPathSuffixes, DoingConfigs, DoingHints };
  Doing doing = DoingNone;
  cmsys::RegularExpression version("^[0-9.]+$");
  bool haveVersion = false;
  std::set<unsigned int> configArgs;
  std::set<unsigned int> moduleArgs;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "QUIET")
      {
      this->Quiet = true;
      doing = DoingNone;
      }
    else if(args[i] == "EXACT")
      {
      this->VersionExact = true;
      doing = DoingNone;
      }
    else if(args[i] == "MODULE")
      {
      moduleArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "CONFIG")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_MODULE")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "REQUIRED")
      {
      this->Required = true;
      doing = DoingComponents;
      }
    else if(args[i] == "COMPONENTS")
      {
      doing = DoingComponents;
      }
    else if(args[i] == "OPTIONAL_COMPONENTS")
      {
      doing = DoingOptionalComponents;
      }
    else if(args[i] == "NAMES")
      {
      configArgs.insert(i);
      doing = DoingNames;
      }
    else if(args[i] == "PATHS")
      {
      configArgs.insert(i);
      doing = DoingPaths;
      }
    else if(args[i] == "HINTS")
      {
      configArgs.insert(i);
      doing = DoingHints;
      }
    else if(args[i] == "PATH_SUFFIXES")
      {
      configArgs.insert(i);
      doing = DoingPathSuffixes;
      }
    else if(args[i] == "CONFIGS")
      {
      configArgs.insert(i);
      doing = DoingConfigs;
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      this->PolicyScope = false;
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_PACKAGE_REGISTRY")
      {
      this->NoUserRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_SYSTEM_PACKAGE_REGISTRY")
      {
      this->NoSystemRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_BUILDS_PATH")
      {
      // Ignore legacy option.
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(this->CheckCommonArgument(args[i]))
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if((doing == DoingComponents) || (doing == DoingOptionalComponents))
      {
      // Set a variable telling the find script whether this component
      // is required.
      const char* isRequired = "1";
      if (doing == DoingOptionalComponents)
        {
        isRequired = "0";
        optionalComponents.insert(args[i]);
        }
      else
        {
        requiredComponents.insert(args[i]);
        }

      std::string req_var = this->Name + "_FIND_REQUIRED_" + args[i];
      this->AddFindDefinition(req_var, isRequired);

      // Append to the list of required components.
      components += components_sep;
      components += args[i];
      components_sep = ";";
      }
    else if(doing == DoingNames)
      {
      this->Names.push_back(args[i]);
      }
    else if(doing == DoingPaths)
      {
      this->UserGuessArgs.push_back(args[i]);
      }
    else if(doing == DoingHints)
      {
      this->UserHintsArgs.push_back(args[i]);
      }
    else if(doing == DoingPathSuffixes)
      {
      this->AddPathSuffix(args[i]);
      }
    else if(doing == DoingConfigs)
      {
      if(args[i].find_first_of(":/\\") != args[i].npos ||
         cmSystemTools::GetFilenameLastExtension(args[i]) != ".cmake")
        {
        std::ostringstream e;
        e << "given CONFIGS option followed by invalid file name \""
          << args[i] << "\".  The names given must be file names without "
          << "a path and with a \".cmake\" extension.";
        this->SetError(e.str());
        return false;
        }
      this->Configs.push_back(args[i]);
      }
    else if(!haveVersion && version.find(args[i].c_str()))
      {
      haveVersion = true;
      this->Version = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "called with invalid argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  std::vector<std::string> doubledComponents;
  std::set_intersection(requiredComponents.begin(), requiredComponents.end(),
                        optionalComponents.begin(), optionalComponents.end(),
                        std::back_inserter(doubledComponents));
  if(!doubledComponents.empty())
    {
    std::ostringstream e;
    e << "called with components that are both required and optional:\n";
    e << cmWrap("  ", doubledComponents, "", "\n") << "\n";
    this->SetError(e.str());
    return false;
    }

  // Maybe choose one mode exclusively.
  this->UseFindModules = configArgs.empty();
  this->UseConfigFiles = moduleArgs.empty();
  if(!this->UseFindModules && !this->UseConfigFiles)
    {
    std::ostringstream e;
    e << "given options exclusive to Module mode:\n";
    for(std::set<unsigned int>::const_iterator si = moduleArgs.begin();
        si != moduleArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "and options exclusive to Config mode:\n";
    for(std::set<unsigned int>::const_iterator si = configArgs.begin();
        si != configArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "The options are incompatible.";
    this->SetError(e.str());
    return false;
    }

  // Ignore EXACT with no version.
  if(this->Version.empty() && this->VersionExact)
    {
    this->VersionExact = false;
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING, "Ignoring EXACT since no version is requested.");
    }

  if(this->Version.empty() || components.empty())
    {
    // Check whether we are recursing inside "Find<name>.cmake" within
    // another find_package(<name>) call.
    std::string mod = this->Name;
    mod += "_FIND_MODULE";
    if(this->Makefile->IsOn(mod))
      {
      if(this->Version.empty())
        {
        // Get version information from the outer call if necessary.
        // Requested version string.
        std::string ver = this->Name;
        ver += "_FIND_VERSION";
        this->Version = this->Makefile->GetSafeDefinition(ver);

        // Whether an exact version is required.
        std::string exact = this->Name;
        exact += "_FIND_VERSION_EXACT";
        this->VersionExact = this->Makefile->IsOn(exact);
        }
      if(components.empty())
        {
        std::string components_var = this->Name + "_FIND_COMPONENTS";
        components = this->Makefile->GetSafeDefinition(components_var);
        }
      }
    }

  if(!this->Version.empty())
    {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    unsigned int parsed_major;
    unsigned int parsed_minor;
    unsigned int parsed_patch;
    unsigned int parsed_tweak;
    this->VersionCount = sscanf(this->Version.c_str(), "%u.%u.%u.%u",
                                &parsed_major, &parsed_minor,
                                &parsed_patch, &parsed_tweak);
    switch(this->VersionCount)
      {
      case 4: this->VersionTweak = parsed_tweak; // no break!
      case 3: this->VersionPatch = parsed_patch; // no break!
      case 2: this->VersionMinor = parsed_minor; // no break!
      case 1: this->VersionMajor = parsed_major; // no break!
      default: break;
      }
    }

  std::string disableFindPackageVar = "CMAKE_DISABLE_FIND_PACKAGE_";
  disableFindPackageVar += this->Name;
  if(this->Makefile->IsOn(disableFindPackageVar))
    {
    if (this->Required)
      {
      std::ostringstream e;
      e << "for module " << this->Name << " called with REQUIRED, but "
        << disableFindPackageVar
        << " is enabled. A REQUIRED package cannot be disabled.";
      this->SetError(e.str());
      return false;
      }

    return true;
    }


  this->SetModuleVariables(components);

  // See if there is a Find<package>.cmake module.
  if(this->UseFindModules)
    {
    bool foundModule = false;
    if(!this->FindModule(foundModule))
      {
      this->AppendSuccessInformation();
      return false;
      }
    if(foundModule)
      {
      this->AppendSuccessInformation();
      return true;
      }
    }

  if(this->UseFindModules && this->UseConfigFiles &&
     this->Makefile->IsOn("CMAKE_FIND_PACKAGE_WARN_NO_MODULE"))
    {
    std::ostringstream aw;
    if(this->RequiredCMakeVersion >= CMake_VERSION_ENCODE(2,8,8))
      {
      aw << "find_package called without either MODULE or CONFIG option and "
        "no Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add MODULE to exclusively request Module mode and fail if "
        "Find" << this->Name << ".cmake is missing.  "
        "Add CONFIG to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  ";
      }
    else
      {
      aw << "find_package called without NO_MODULE option and no "
        "Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add NO_MODULE to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  "
        "Otherwise make Find" << this->Name << ".cmake available in "
        "CMAKE_MODULE_PATH.";
      }
    aw << "\n"
      "(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, aw.str());
    }

  // No find module.  Assume the project has a CMake config file.  Use
  // a <package>_DIR cache variable to locate it.
  this->Variable = this->Name;
  this->Variable += "_DIR";

  // Add the default name.
  if(this->Names.empty())
    {
    this->Names.push_back(this->Name);
    }

  // Add the default configs.
  if(this->Configs.empty())
    {
    for(std::vector<std::string>::const_iterator ni = this->Names.begin();
        ni != this->Names.end(); ++ni)
      {
      std::string config = *ni;
      config += "Config.cmake";
      this->Configs.push_back(config);

      config = cmSystemTools::LowerCase(*ni);
      config += "-config.cmake";
      this->Configs.push_back(config);
      }
    }

  // get igonored paths from vars and reroot them.
  std::vector<std::string> ignored;
  this->GetIgnoredPaths(ignored);
  this->RerootPaths(ignored);

  // Construct a set of ignored paths
  this->IgnoredPaths.clear();
  this->IgnoredPaths.insert(ignored.begin(), ignored.end());

  // Find and load the package.
  bool result = this->HandlePackageMode();
  this->AppendSuccessInformation();
  return result;
}